

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hts_engine.c
# Opt level: O3

int main(int argc,char **argv)

{
  char **ppcVar1;
  char cVar2;
  double dVar3;
  bool bVar4;
  HTS_Boolean HVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  int extraout_EAX;
  char **ppcVar9;
  ulong uVar10;
  ulong extraout_RAX;
  char *pcVar11;
  undefined8 *puVar12;
  size_t sVar13;
  size_t num_voices;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  HTS_Engine engine;
  double local_228;
  FILE *local_220;
  FILE *local_218;
  FILE *local_210;
  FILE *local_208;
  FILE *local_200;
  FILE *local_1f8;
  FILE *local_1f0;
  char *local_1e8;
  HTS_Engine local_1d8;
  
  if (argc < 2) {
switchD_00101a8c_caseD_68:
    usage();
  }
  else {
    HTS_Engine_initialize(&local_1d8);
    ppcVar9 = (char **)malloc((ulong)(uint)argc << 3);
    num_voices = 0;
    iVar7 = 0;
    do {
      pcVar11 = argv[iVar7];
      iVar6 = iVar7;
      if (*pcVar11 == '-') {
        if (pcVar11[1] == 'm') {
          iVar6 = iVar7 + 1;
          pcVar11 = argv[(long)iVar7 + 1];
          ppcVar9[num_voices] = pcVar11;
          num_voices = num_voices + 1;
          if (*pcVar11 != '-') goto LAB_001019d9;
        }
        if (pcVar11[1] == 'h') goto switchD_00101a8c_caseD_68;
      }
LAB_001019d9:
      iVar7 = iVar6 + 1;
    } while (iVar7 < argc);
    if (num_voices != 0) {
      HVar5 = HTS_Engine_load(&local_1d8,ppcVar9,num_voices);
      if (HVar5 != '\x01') goto LAB_00101ff7;
      free(ppcVar9);
      iVar7 = argc + -1;
      if (iVar7 == 0) {
        local_218 = (FILE *)0x0;
        HVar5 = HTS_Engine_synthesize_from_fn(&local_1d8,(char *)0x0);
        bVar4 = true;
        bVar17 = true;
        bVar15 = true;
        local_228._0_1_ = '\x01';
        cVar2 = local_228._0_1_;
        local_228._0_1_ = '\x01';
        local_220 = (FILE *)0x0;
        local_1f8 = (FILE *)0x0;
        local_210 = (FILE *)0x0;
        local_208 = (FILE *)0x0;
        local_200 = (FILE *)0x0;
        local_1f0 = (FILE *)0x0;
        bVar14 = true;
        bVar16 = true;
        bVar18 = true;
        if (HVar5 == '\x01') goto LAB_00101f55;
LAB_00101e61:
        local_228._0_1_ = cVar2;
        main_cold_7();
LAB_00101e6b:
        local_1f0 = (FILE *)0x0;
      }
      else {
        local_1f0 = (FILE *)0x0;
        local_200 = (FILE *)0x0;
        local_208 = (FILE *)0x0;
        local_210 = (FILE *)0x0;
        local_1f8 = (FILE *)0x0;
        local_220 = (FILE *)0x0;
        local_218 = (FILE *)0x0;
        local_1e8 = (char *)0x0;
        do {
          pcVar11 = argv[1];
          ppcVar9 = argv + 1;
          if (*pcVar11 != '-') goto LAB_00101cf6;
          switch(pcVar11[1]) {
          case 'a':
            dVar3 = atof(argv[2]);
            HTS_Engine_set_alpha(&local_1d8,dVar3);
            break;
          case 'b':
            dVar3 = atof(argv[2]);
            HTS_Engine_set_beta(&local_1d8,dVar3);
            break;
          default:
switchD_00101a8c_caseD_63:
            main_cold_6();
LAB_0010203f:
            main_cold_2();
            uVar10 = extraout_RAX;
switchD_00101c0a_caseD_65:
            puVar12 = (undefined8 *)(uVar10 & 0xff);
            main_cold_4();
            *(undefined8 *)((long)puVar12 + 9) = 0;
            *(undefined8 *)((long)puVar12 + 0x11) = 0;
            *puVar12 = 0;
            puVar12[1] = 0;
            puVar12[4] = 0x3ff0000000000000;
            puVar12[5] = 0;
            puVar12[6] = 0;
            puVar12[8] = 0x3ff0000000000000;
            *(undefined1 *)(puVar12 + 7) = 0;
            puVar12[9] = 0;
            *(undefined1 *)(puVar12 + 10) = 0;
            puVar12[0xb] = 0;
            puVar12[0xc] = 0;
            puVar12[0xd] = 0;
            puVar12[0xe] = 0;
            puVar12[0xf] = 0;
            puVar12[0x10] = 0;
            HTS_Audio_initialize((HTS_Audio *)(puVar12 + 0x11));
            HTS_ModelSet_initialize((HTS_ModelSet *)(puVar12 + 0x16));
            HTS_Label_initialize((HTS_Label *)(puVar12 + 0x25));
            HTS_SStreamSet_initialize((HTS_SStreamSet *)(puVar12 + 0x27));
            HTS_PStreamSet_initialize((HTS_PStreamSet *)(puVar12 + 0x2d));
            HTS_GStreamSet_initialize((HTS_GStreamSet *)(puVar12 + 0x30));
            return extraout_EAX;
          case 'f':
            if (pcVar11[2] != 'm') {
              main_cold_3();
              goto switchD_00101a8c_caseD_63;
            }
            dVar3 = atof(argv[2]);
            HTS_Engine_add_half_tone(&local_1d8,dVar3);
            break;
          case 'g':
            dVar3 = atof(argv[2]);
            HTS_Engine_set_volume(&local_1d8,dVar3);
            break;
          case 'h':
            goto switchD_00101a8c_caseD_68;
          case 'i':
            uVar8 = atoi(argv[2]);
            if (num_voices == (long)(int)uVar8) {
              ppcVar9 = argv + 2;
              if (uVar8 == 0) break;
              sVar13 = 0;
              do {
                ppcVar1 = ppcVar9 + 1;
                ppcVar9 = ppcVar9 + 1;
                local_228 = atof(*ppcVar1);
                HTS_Engine_set_duration_interpolation_weight(&local_1d8,sVar13,local_228);
                HTS_Engine_set_parameter_interpolation_weight(&local_1d8,sVar13,0,local_228);
                HTS_Engine_set_parameter_interpolation_weight(&local_1d8,sVar13,1,local_228);
                HTS_Engine_set_gv_interpolation_weight(&local_1d8,sVar13,0,local_228);
                HTS_Engine_set_gv_interpolation_weight(&local_1d8,sVar13,1,local_228);
                sVar13 = sVar13 + 1;
              } while (uVar8 != sVar13);
              iVar7 = (argc + -2) - uVar8;
              pcVar11 = local_1e8;
              goto LAB_00101cf6;
            }
            goto LAB_00102011;
          case 'j':
            cVar2 = pcVar11[2];
            if (cVar2 != 'p') {
              if (cVar2 == 'm') {
                sVar13 = 0;
                goto LAB_00101cd4;
              }
              if (cVar2 == 'f') goto LAB_00101c45;
              goto LAB_0010203f;
            }
LAB_00101c45:
            sVar13 = 1;
LAB_00101cd4:
            dVar3 = atof(argv[2]);
            HTS_Engine_set_gv_weight(&local_1d8,sVar13,dVar3);
            break;
          case 'm':
            break;
          case 'o':
            uVar10 = (ulong)(byte)pcVar11[2];
            switch(pcVar11[2]) {
            case 'd':
              local_218 = fopen(argv[2],"wt");
              break;
            default:
              goto switchD_00101c0a_caseD_65;
            case 'f':
            case 'p':
              local_1f8 = fopen(argv[2],"wb");
              break;
            case 'l':
              local_210 = fopen(argv[2],"wb");
              break;
            case 'm':
              local_220 = fopen(argv[2],"wb");
              break;
            case 'r':
              local_200 = fopen(argv[2],"wb");
              break;
            case 't':
              local_1f0 = fopen(argv[2],"wt");
              break;
            case 'w':
              local_208 = fopen(argv[2],"wb");
            }
            break;
          case 'p':
            iVar7 = atoi(argv[2]);
            HTS_Engine_set_fperiod(&local_1d8,(long)iVar7);
            break;
          case 'r':
            dVar3 = atof(argv[2]);
            HTS_Engine_set_speed(&local_1d8,dVar3);
            break;
          case 's':
            iVar7 = atoi(argv[2]);
            HTS_Engine_set_sampling_frequency(&local_1d8,(long)iVar7);
            break;
          case 'u':
            dVar3 = atof(argv[2]);
            HTS_Engine_set_msd_threshold(&local_1d8,1,dVar3);
            break;
          case 'v':
            if (pcVar11[2] == 'p') {
              HTS_Engine_set_phoneme_alignment_flag(&local_1d8,'\x01');
              pcVar11 = local_1e8;
              goto LAB_00101cf6;
            }
            goto LAB_00102004;
          case 'z':
            iVar7 = atoi(argv[2]);
            HTS_Engine_set_audio_buff_size(&local_1d8,(long)iVar7);
          }
          ppcVar9 = argv + 2;
          iVar7 = argc + -2;
          pcVar11 = local_1e8;
LAB_00101cf6:
          local_1e8 = pcVar11;
          argc = iVar7;
          argv = ppcVar9;
          iVar7 = argc + -1;
        } while (iVar7 != 0);
        HVar5 = HTS_Engine_synthesize_from_fn(&local_1d8,local_1e8);
        cVar2 = local_228._0_1_;
        if (HVar5 != '\x01') goto LAB_00101e61;
        local_228._0_1_ = local_1f0 == (FILE *)0x0;
        if ((bool)local_228._0_1_) goto LAB_00101e6b;
        HTS_Engine_save_information(&local_1d8,(FILE *)local_1f0);
      }
      bVar14 = local_218 == (FILE *)0x0;
      if (bVar14) {
        local_218 = (FILE *)0x0;
      }
      else {
        HTS_Engine_save_label(&local_1d8,(FILE *)local_218);
      }
      bVar15 = local_200 == (FILE *)0x0;
      if (bVar15) {
        local_200 = (FILE *)0x0;
      }
      else {
        HTS_Engine_save_generated_speech(&local_1d8,(FILE *)local_200);
      }
      bVar16 = local_208 == (FILE *)0x0;
      if (bVar16) {
        local_208 = (FILE *)0x0;
      }
      else {
        HTS_Engine_save_riff(&local_1d8,(FILE *)local_208);
      }
      bVar17 = local_220 == (FILE *)0x0;
      if (bVar17) {
        local_220 = (FILE *)0x0;
      }
      else {
        HTS_Engine_save_generated_parameter(&local_1d8,0,(FILE *)local_220);
      }
      bVar18 = local_1f8 == (FILE *)0x0;
      if (bVar18) {
        local_1f8 = (FILE *)0x0;
      }
      else {
        HTS_Engine_save_generated_parameter(&local_1d8,1,(FILE *)local_1f8);
      }
      if (local_210 == (FILE *)0x0) {
        bVar4 = true;
        local_210 = (FILE *)0x0;
      }
      else {
        HTS_Engine_save_generated_parameter(&local_1d8,2,(FILE *)local_210);
        bVar4 = false;
      }
LAB_00101f55:
      HTS_Engine_refresh(&local_1d8);
      HTS_Engine_clear(&local_1d8);
      if (!bVar14) {
        fclose(local_218);
      }
      if (!bVar17) {
        fclose(local_220);
      }
      if (!bVar18) {
        fclose(local_1f8);
      }
      if (!bVar4) {
        fclose(local_210);
      }
      if (!bVar16) {
        fclose(local_208);
      }
      if (!bVar15) {
        fclose(local_200);
      }
      if (local_228._0_1_ == '\0') {
        fclose(local_1f0);
      }
      return 0;
    }
  }
  main_cold_8();
LAB_00101ff7:
  main_cold_1();
LAB_00102004:
  main_cold_5();
LAB_00102011:
  HTS_Engine_clear(&local_1d8);
  exit(1);
}

Assistant:

int main(int argc, char **argv)
{
   int i;
   double f;

   /* hts_engine API */
   HTS_Engine engine;

   /* HTS voices */
   size_t num_voices;
   char **fn_voices;

   /* input label file name */
   char *labfn = NULL;

   /* output file pointers */
   FILE *durfp = NULL, *mgcfp = NULL, *lf0fp = NULL, *lpffp = NULL, *wavfp = NULL, *rawfp = NULL, *tracefp = NULL;

   /* interpolation weights */
   size_t num_interpolation_weights;

   /* output usage */
   if (argc <= 1)
      usage();

   /* initialize hts_engine API */
   HTS_Engine_initialize(&engine);

   /* get HTS voice file names */
   num_voices = 0;
   fn_voices = (char **) malloc(argc * sizeof(char *));
   for (i = 0; i < argc; i++) {
      if (argv[i][0] == '-' && argv[i][1] == 'm')
         fn_voices[num_voices++] = argv[++i];
      if (argv[i][0] == '-' && argv[i][1] == 'h')
         usage();
   }
   if (num_voices == 0) {
      fprintf(stderr, "Error: HTS voice must be specified.\n");
      free(fn_voices);
      exit(1);
   }

   /* load HTS voices */
   if (HTS_Engine_load(&engine, fn_voices, num_voices) != TRUE) {
      fprintf(stderr, "Error: HTS voices cannot be loaded.\n");
      free(fn_voices);
      HTS_Engine_clear(&engine);
      exit(1);
   }
   free(fn_voices);

   /* get options */
   while (--argc) {
      if (**++argv == '-') {
         switch (*(*argv + 1)) {
         case 'v':
            switch (*(*argv + 2)) {
            case 'p':
               HTS_Engine_set_phoneme_alignment_flag(&engine, TRUE);
               break;
            default:
               fprintf(stderr, "Error: Invalid option '-v%c'.\n", *(*argv + 2));
               HTS_Engine_clear(&engine);
               exit(1);
            }
            break;
         case 'o':
            switch (*(*argv + 2)) {
            case 'w':
               wavfp = fopen(*++argv, "wb");
               break;
            case 'r':
               rawfp = fopen(*++argv, "wb");
               break;
            case 'd':
               durfp = fopen(*++argv, "wt");
               break;
            case 'm':
               mgcfp = fopen(*++argv, "wb");
               break;
            case 'f':
            case 'p':
               lf0fp = fopen(*++argv, "wb");
               break;
            case 'l':
               lpffp = fopen(*++argv, "wb");
               break;
            case 't':
               tracefp = fopen(*++argv, "wt");
               break;
            default:
               fprintf(stderr, "Error: Invalid option '-o%c'.\n", *(*argv + 2));
               HTS_Engine_clear(&engine);
               exit(1);
            }
            --argc;
            break;
         case 'h':
            usage();
            break;
         case 'm':
            argv++;             /* HTS voices were already loaded */
            --argc;
            break;
         case 's':
            HTS_Engine_set_sampling_frequency(&engine, (size_t) atoi(*++argv));
            --argc;
            break;
         case 'p':
            HTS_Engine_set_fperiod(&engine, (size_t) atoi(*++argv));
            --argc;
            break;
         case 'a':
            HTS_Engine_set_alpha(&engine, atof(*++argv));
            --argc;
            break;
         case 'b':
            HTS_Engine_set_beta(&engine, atof(*++argv));
            --argc;
            break;
         case 'r':
            HTS_Engine_set_speed(&engine, atof(*++argv));
            --argc;
            break;
         case 'f':
            switch (*(*argv + 2)) {
            case 'm':
               HTS_Engine_add_half_tone(&engine, atof(*++argv));
               break;
            default:
               fprintf(stderr, "Error: Invalid option '-f%c'.\n", *(*argv + 2));
               HTS_Engine_clear(&engine);
               exit(1);
            }
            --argc;
            break;
         case 'u':
            HTS_Engine_set_msd_threshold(&engine, 1, atof(*++argv));
            --argc;
            break;
         case 'i':
            num_interpolation_weights = atoi(*++argv);
            argc--;
            if (num_interpolation_weights != num_voices) {
               HTS_Engine_clear(&engine);
               exit(1);
            }
            for (i = 0; i < num_interpolation_weights; i++) {
               f = atof(*++argv);
               argc--;
               HTS_Engine_set_duration_interpolation_weight(&engine, i, f);
               HTS_Engine_set_parameter_interpolation_weight(&engine, i, 0, f);
               HTS_Engine_set_parameter_interpolation_weight(&engine, i, 1, f);
               HTS_Engine_set_gv_interpolation_weight(&engine, i, 0, f);
               HTS_Engine_set_gv_interpolation_weight(&engine, i, 1, f);
            }
            break;
         case 'j':
            switch (*(*argv + 2)) {
            case 'm':
               HTS_Engine_set_gv_weight(&engine, 0, atof(*++argv));
               break;
            case 'f':
            case 'p':
               HTS_Engine_set_gv_weight(&engine, 1, atof(*++argv));
               break;
            default:
               fprintf(stderr, "Error: Invalid option '-j%c'.\n", *(*argv + 2));
               HTS_Engine_clear(&engine);
               exit(1);
            }
            --argc;
            break;
         case 'g':
            HTS_Engine_set_volume(&engine, atof(*++argv));
            --argc;
            break;
         case 'z':
            HTS_Engine_set_audio_buff_size(&engine, (size_t) atoi(*++argv));
            --argc;
            break;
         default:
            fprintf(stderr, "Error: Invalid option '-%c'.\n", *(*argv + 1));
            HTS_Engine_clear(&engine);
            exit(1);
         }
      } else {
         labfn = *argv;
      }
   }

   /* synthesize */
   if (HTS_Engine_synthesize_from_fn(&engine, labfn) != TRUE) {
      fprintf(stderr, "Error: waveform cannot be synthesized.\n");
      HTS_Engine_clear(&engine);
      exit(1);
   }

   /* output */
   if (tracefp != NULL)
      HTS_Engine_save_information(&engine, tracefp);
   if (durfp != NULL)
      HTS_Engine_save_label(&engine, durfp);
   if (rawfp)
      HTS_Engine_save_generated_speech(&engine, rawfp);
   if (wavfp)
      HTS_Engine_save_riff(&engine, wavfp);
   if (mgcfp)
      HTS_Engine_save_generated_parameter(&engine, 0, mgcfp);
   if (lf0fp)
      HTS_Engine_save_generated_parameter(&engine, 1, lf0fp);
   if (lpffp)
      HTS_Engine_save_generated_parameter(&engine, 2, lpffp);

   /* reset */
   HTS_Engine_refresh(&engine);

   /* free memory */
   HTS_Engine_clear(&engine);

   /* close files */
   if (durfp != NULL)
      fclose(durfp);
   if (mgcfp != NULL)
      fclose(mgcfp);
   if (lf0fp != NULL)
      fclose(lf0fp);
   if (lpffp != NULL)
      fclose(lpffp);
   if (wavfp != NULL)
      fclose(wavfp);
   if (rawfp != NULL)
      fclose(rawfp);
   if (tracefp != NULL)
      fclose(tracefp);

   return 0;
}